

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane.cpp
# Opt level: O1

Color * __thiscall Plane::getTextureColor(Color *__return_storage_ptr__,Plane *this,Vector3 *p)

{
  Material *pMVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Vector3 local_48;
  
  pMVar1 = (this->super_Object).m_material;
  if (pMVar1->m_texture_func == (_func_Color_double_double *)0x0 && pMVar1->m_texture == (Bmp *)0x0)
  {
    __return_storage_ptr__->r = 1.0;
    __return_storage_ptr__->g = 1.0;
    __return_storage_ptr__->b = 1.0;
  }
  else {
    operator-(p,&this->m_o);
    dVar2 = Vector3::dot(&local_48,&this->m_dx);
    dVar3 = Vector3::mod2(&this->m_dx);
    operator-(p,&this->m_o);
    dVar4 = Vector3::dot(&local_48,&this->m_dy);
    dVar5 = Vector3::mod2(&this->m_dy);
    dVar6 = floor(dVar2 / dVar3);
    dVar7 = floor(dVar4 / dVar5);
    Material::getTextureColor
              (__return_storage_ptr__,(this->super_Object).m_material,dVar2 / dVar3 - dVar6,
               dVar4 / dVar5 - dVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

Color Plane::getTextureColor(const Vector3& p) const
{
    if (m_material->hasTexture())
    {
        double u = (p - m_o).dot(m_dx) / m_dx.mod2(),
               v = (p - m_o).dot(m_dy) / m_dy.mod2();
        u -= floor(u), v -= floor(v);
        return m_material->getTextureColor(u, v);
    }
    else
        return Color(1, 1, 1);
}